

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpki.c
# Opt level: O0

err_t bpkiCSRRewrap(octet *csr,size_t csr_len,octet *privkey,size_t privkey_len)

{
  bool_t bVar1;
  size_t sVar2;
  octet *hash_00;
  long in_RCX;
  void *in_RDX;
  size_t in_RSI;
  void *in_RDI;
  octet *hash;
  size_t oid_len;
  octet oid_der [16];
  bign_params params [1];
  bpki_csr_info_t ci [1];
  size_t count;
  err_t code;
  bign_params *in_stack_fffffffffffffe28;
  size_t *in_stack_fffffffffffffe30;
  octet *in_stack_fffffffffffffe38;
  octet *in_stack_fffffffffffffe68;
  bign_params *in_stack_fffffffffffffe70;
  octet *in_stack_fffffffffffffe78;
  void *in_stack_fffffffffffffe80;
  octet *in_stack_fffffffffffffea0;
  octet *in_stack_fffffffffffffea8;
  size_t in_stack_fffffffffffffeb0;
  octet *in_stack_fffffffffffffeb8;
  bign_params *in_stack_fffffffffffffec0;
  octet *in_stack_fffffffffffffec8;
  void *in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffee8;
  size_t in_stack_ffffffffffffff48;
  octet *in_stack_ffffffffffffff50;
  bpki_csr_info_t *in_stack_ffffffffffffff58;
  err_t local_4;
  
  if (in_RCX == 0x20) {
    bVar1 = memIsValid(in_RDI,in_RSI);
    if ((bVar1 == 0) || (bVar1 = memIsValid(in_RDX,0x20), bVar1 == 0)) {
      local_4 = 0x6d;
    }
    else {
      sVar2 = bpkiCSRDec(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                         in_stack_ffffffffffffff48);
      if ((sVar2 == 0xffffffffffffffff) || (sVar2 != in_RSI)) {
        local_4 = 0x132;
      }
      else {
        local_4 = bignParamsStd(in_stack_fffffffffffffe28,(char *)0x14eabf);
        if ((local_4 == 0) &&
           (local_4 = bignPubkeyCalc(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                                     in_stack_fffffffffffffe68), local_4 == 0)) {
          bVar1 = rngIsValid();
          if (bVar1 != 0) {
            rngStepR(in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78,
                     in_stack_fffffffffffffe70);
          }
          local_4 = bignOidToDER(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                 (char *)in_stack_fffffffffffffe28);
          if (local_4 == 0) {
            hash_00 = (octet *)blobCreate((size_t)in_stack_fffffffffffffe28);
            if (hash_00 == (octet *)0x0) {
              local_4 = 0x6e;
            }
            else {
              local_4 = beltHash(hash_00,in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28
                                );
              if (local_4 == 0) {
                local_4 = bignSign2(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                    in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                                    in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                                    in_stack_fffffffffffffee0,in_stack_fffffffffffffee8);
                blobClose((blob_t)0x14ec5e);
              }
              else {
                blobClose((blob_t)0x14ebef);
              }
            }
          }
        }
      }
    }
  }
  else {
    local_4 = 0x77;
  }
  return local_4;
}

Assistant:

err_t bpkiCSRRewrap(octet csr[], size_t csr_len, const octet privkey[],
	size_t privkey_len)
{
	err_t code;
	size_t count;
	bpki_csr_info_t ci[1];
	bign_params params[1];
	octet oid_der[16];
	size_t oid_len = sizeof(oid_der);
	octet* hash;
	// входной контроль
	if (privkey_len != 32)
		return ERR_NOT_IMPLEMENTED;
	if (!memIsValid(csr, csr_len) || !memIsValid(privkey, 32))
		return ERR_BAD_INPUT;
	// разобрать запрос
	count = bpkiCSRDec(ci, csr, csr_len);
	if (count == SIZE_MAX || count != csr_len)
		return ERR_BAD_FORMAT;
	// загрузить стандартные параметры
	code = bignParamsStd(params, oid_bign_curve256v1);
	ERR_CALL_CHECK(code);
	// сгенерировать открытый ключ
	code = bignPubkeyCalc(csr + ci->pubkey_offset, params, privkey);
	ERR_CALL_CHECK(code);
	// получить случайные числа
	if (rngIsValid())
		rngStepR(csr + ci->sig_offset, 48, 0);
	// кодировать идентификатор алгоритма хэширования
	code = bignOidToDER(oid_der, &oid_len, oid_belt_hash);
	ERR_CALL_CHECK(code);
	// хэшировать
	if (!(hash = blobCreate(32)))
		return ERR_OUTOFMEMORY;
	code = beltHash(hash, csr + ci->body_offset, ci->body_len);
	ERR_CALL_HANDLE(code, blobClose(hash));
	// подписать
	code = bignSign2(csr + ci->sig_offset, params, oid_der, oid_len,
		hash, privkey, csr + ci->sig_offset, 48);
	// завершить
	blobClose(hash);
	return code;
}